

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O3

FieldFamily
google::protobuf::compiler::cpp::MessageLayoutHelper::GetFieldFamily
          (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  byte bVar1;
  bool bVar2;
  FieldFamily FVar3;
  
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    if ((bVar1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
        FVar3 = STRING;
      }
      else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        FVar3 = MESSAGE;
      }
      else {
        bVar2 = CanInitializeByZeroing(field,options,scc_analyzer);
        FVar3 = OTHER - bVar2;
      }
    }
    else {
      bVar2 = ShouldSplit(field,options);
      FVar3 = (uint)bVar2 << 2;
    }
    return FVar3;
  }
  GetFieldFamily();
}

Assistant:

MessageLayoutHelper::FieldFamily MessageLayoutHelper::GetFieldFamily(
    const FieldDescriptor* field, const Options& options,
    MessageSCCAnalyzer* scc_analyzer) {
  if (field->is_repeated()) {
    return ShouldSplit(field, options) ? OTHER : REPEATED;
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    return STRING;
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return MESSAGE;
  } else if (CanInitializeByZeroing(field, options, scc_analyzer)) {
    return ZERO_INITIALIZABLE;
  } else {
    return OTHER;
  }
}